

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_filtering.cpp
# Opt level: O2

pair<double,_double>
anon_unknown.dwarf_ff563::FilterFunctionTest(filterFunction Filter,uint32_t size)

{
  uchar value;
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  Image output;
  TimerContainer timer;
  Image input;
  
  Performance_Test::TimerContainer::TimerContainer(&timer);
  value = Test_Helper::randomValue<unsigned_char>('\x01',0x100);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,size,size,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&output,input._width,input._height,'\x01','\x01');
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start(&timer);
    (*Filter)(&input,&output);
    Performance_Test::TimerContainer::stop(&timer);
    uVar2 = uVar2 + 1;
  }
  pVar3 = Performance_Test::BaseTimerContainer::mean(&timer.super_BaseTimerContainer);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  Performance_Test::TimerContainer::~TimerContainer(&timer.super_BaseTimerContainer);
  return pVar3;
}

Assistant:

std::pair < double, double > FilterFunctionTest( filterFunction Filter, uint32_t size )
    {
        Performance_Test::TimerContainer timer;

        PenguinV_Image::Image input = Performance_Test::uniformImage( Performance_Test::randomValue<uint8_t>( 1, 256 ), size, size );
        PenguinV_Image::Image output( input.width(), input.height() );

        for( uint32_t i = 0; i < Performance_Test::runCount(); ++i ) {
            timer.start();

            Filter( input, output );

            timer.stop();
        }

        return timer.mean();
    }